

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

file_status __thiscall ghc::filesystem::symlink_status(filesystem *this,path *p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  filesystem_error *this_00;
  error_code ec;
  string local_40;
  
  uVar2 = std::_V2::system_category();
  symlink_status((path *)this,(error_code *)p);
  if (*(int *)this != 0) {
    return (file_status)this;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_40,0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  filesystem_error::filesystem_error(this_00,&local_40,(error_code)(auVar1 << 0x40));
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_status symlink_status(const path& p)
{
    std::error_code ec;
    auto result = symlink_status(p, ec);
    if (result.type() == file_type::none) {
        throw filesystem_error(detail::systemErrorText(ec.value()), ec);
    }
    return result;
}